

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classviewer.cpp
# Opt level: O2

void print_Fields(ClassFile *classFile)

{
  u2 accessFlags;
  ushort index;
  u2 index_00;
  ushort uVar1;
  field_info *pfVar2;
  FILE *pFVar3;
  char *pcVar4;
  attribute_info *paVar5;
  ulong uVar6;
  u2 j;
  ulong uVar7;
  
  for (uVar6 = 0; pFVar3 = out, uVar6 < classFile->fields_count; uVar6 = uVar6 + 1) {
    pfVar2 = classFile->fields;
    accessFlags = pfVar2[uVar6].access_flags;
    index = pfVar2[uVar6].name_index;
    index_00 = pfVar2[uVar6].descriptor_index;
    uVar1 = pfVar2[uVar6].attributes_count;
    paVar5 = pfVar2[uVar6].attributes;
    pcVar4 = getFormattedConstant(classFile->constant_pool,index);
    fprintf((FILE *)pFVar3,"\t[%hu] %s\n",uVar6 & 0xffffffff,pcVar4);
    fwrite("\t{\n",3,1,(FILE *)out);
    pFVar3 = out;
    pcVar4 = getFormattedConstant(classFile->constant_pool,index);
    fprintf((FILE *)pFVar3,"\t\tName: \t\t\t cp_info #%hu <%s>\n ",(ulong)index,pcVar4);
    pFVar3 = out;
    pcVar4 = getFormattedConstant(classFile->constant_pool,index_00);
    fprintf((FILE *)pFVar3,"\t\tDescriptor: \t cp_info #%hu <%s>\n ",(ulong)index_00,pcVar4);
    pFVar3 = out;
    pcVar4 = getAccessFlags(accessFlags);
    fprintf((FILE *)pFVar3,"\t\tAccess flags: \t %x [%s]\n",(ulong)accessFlags,pcVar4);
    fwrite("\t\tAttributes:\n",0xe,1,(FILE *)out);
    for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
      print_AttributeInfo(*paVar5,(uint32_t)uVar7,classFile->constant_pool,'\x03');
      paVar5 = paVar5 + 1;
    }
    fwrite("\t}\n",3,1,(FILE *)out);
  }
  return;
}

Assistant:

void print_Fields(ClassFile *classFile) {
	for (u2 i = 0; i < classFile->fields_count; i++) {
        field_info field = classFile->fields[i];
        
		fprintf(out,"\t[%hu] %s\n", i, getFormattedConstant(classFile->constant_pool, field.name_index));
		fprintf(out, "\t{\n");
		
		fprintf(out,"\t\tName: \t\t\t cp_info #%hu <%s>\n ", field.name_index, getFormattedConstant(classFile->constant_pool, field.name_index));
		fprintf(out,"\t\tDescriptor: \t cp_info #%hu <%s>\n ", field.descriptor_index, getFormattedConstant(classFile->constant_pool, field.descriptor_index));
		fprintf(out,"\t\tAccess flags: \t %x [%s]\n", field.access_flags, getAccessFlags(field.access_flags));
        
        fprintf(out,"\t\tAttributes:\n");
        
		for (u2 j = 0; j < field.attributes_count; j++) {
            print_AttributeInfo(field.attributes[j], j, classFile->constant_pool, 3);
		}
        
		fprintf(out, "\t}\n");
	}
}